

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_fmin(Forth *this)

{
  double Value;
  double dVar1;
  double r2;
  double r1;
  Forth *this_local;
  
  requireFStackDepth(this,2,"FMIN");
  Value = ForthStack<double>::getTop(&this->fStack,0);
  ForthStack<double>::pop(&this->fStack);
  dVar1 = ForthStack<double>::getTop(&this->fStack,0);
  if (Value < dVar1) {
    ForthStack<double>::setTop(&this->fStack,Value);
  }
  return;
}

Assistant:

void f_fmin() {
			REQUIRE_FSTACK_DEPTH(2, "FMIN");
			auto r1 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0);
			if (r1 < r2){
				fStack.setTop(r1);
			}
		}